

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O0

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx,MppMeta meta)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int local_3c;
  RK_S32 i;
  RoiRegionCfg *regions;
  MppEncROICfg *roi_cfg;
  MppEncROIRegion *region;
  MppEncRoiImpl *impl;
  MppMeta meta_local;
  MppEncRoiCtx ctx_local;
  
  iVar1 = *(int *)((long)ctx + 0x20);
  if (iVar1 == 1) {
    if (*(int *)((long)ctx + 8) == 7) {
      gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0x78));
    }
    else if (*(int *)((long)ctx + 8) == 0x1000004) {
      gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
      vepu54x_h265_set_roi
                (*(void **)((long)ctx + 0x78),*(void **)((long)ctx + 0xb8),*ctx,
                 *(RK_S32 *)((long)ctx + 4));
    }
    mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
    mpp_buffer_sync_end_f(*(undefined8 *)((long)ctx + 0x48),1,"mpp_enc_roi_setup_meta");
  }
  else if (iVar1 == 2) {
    gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
    if (*(int *)((long)ctx + 8) == 7) {
      gen_vepu580_roi_h264((MppEncRoiImpl *)ctx);
    }
    else if (*(int *)((long)ctx + 8) == 0x1000004) {
      gen_vepu580_roi_h265((MppEncRoiImpl *)ctx);
    }
    mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
    mpp_buffer_sync_end_f(*(undefined8 *)((long)ctx + 0x48),1,"mpp_enc_roi_setup_meta");
    mpp_buffer_sync_end_f(*(undefined8 *)((long)ctx + 0x50),1,"mpp_enc_roi_setup_meta");
  }
  else if (iVar1 == 0x10) {
    lVar2 = *(long *)((long)ctx + 0x38);
    lVar3 = *(long *)((long)ctx + 0x10);
    for (local_3c = 0; local_3c < *(int *)((long)ctx + 0x1c); local_3c = local_3c + 1) {
      *(undefined2 *)(lVar2 + (long)local_3c * 0x10) =
           *(undefined2 *)(lVar3 + (long)local_3c * 0x14);
      *(undefined2 *)(lVar2 + (long)local_3c * 0x10 + 2) =
           *(undefined2 *)(lVar3 + (long)local_3c * 0x14 + 2);
      *(undefined2 *)(lVar2 + (long)local_3c * 0x10 + 4) =
           *(undefined2 *)(lVar3 + (long)local_3c * 0x14 + 4);
      *(undefined2 *)(lVar2 + (long)local_3c * 0x10 + 6) =
           *(undefined2 *)(lVar3 + (long)local_3c * 0x14 + 6);
      *(short *)(lVar2 + (long)local_3c * 0x10 + 8) =
           (short)*(undefined4 *)(lVar3 + (long)local_3c * 0x14 + 8);
      *(char *)(lVar2 + (long)local_3c * 0x10 + 0xf) =
           (char)*(undefined4 *)(lVar3 + (long)local_3c * 0x14 + 0xc);
      *(short *)(lVar2 + (long)local_3c * 0x10 + 10) =
           (short)*(undefined4 *)(lVar3 + (long)local_3c * 0x14 + 0x10);
      *(undefined1 *)(lVar2 + (long)local_3c * 0x10 + 0xe) = 1;
      *(undefined2 *)(lVar2 + (long)local_3c * 0x10 + 0xc) = 0;
    }
    *(undefined4 *)((long)ctx + 0x28) = *(undefined4 *)((long)ctx + 0x1c);
    *(long *)((long)ctx + 0x30) = lVar2;
    mpp_meta_set_ptr(meta,0x726f6920,(undefined4 *)((long)ctx + 0x28));
  }
  *(undefined4 *)((long)ctx + 0x1c) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx, MppMeta meta)
{
    MppEncRoiImpl *impl = (MppEncRoiImpl *)ctx;

    switch (impl->roi_type) {
    case ROI_TYPE_1 : {
        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu54x_roi(impl, impl->dst_base);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu54x_roi(impl, impl->tmp);
            vepu54x_h265_set_roi(impl->dst_base, impl->tmp, impl->w, impl->h);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
    } break;
    case ROI_TYPE_2 : {
        gen_vepu54x_roi(impl, impl->tmp);

        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu580_roi_h264(impl);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu580_roi_h265(impl);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
        mpp_buffer_sync_ro_end(impl->roi_cfg.qp_cfg_buf);
    } break;
    case ROI_TYPE_LEGACY : {
        MppEncROIRegion *region = impl->legacy_roi_region;
        MppEncROICfg *roi_cfg = &impl->legacy_roi_cfg;
        RoiRegionCfg *regions = impl->regions;
        RK_S32 i;

        for (i = 0; i < impl->count; i++) {
            region[i].x = regions[i].x;
            region[i].y = regions[i].y;
            region[i].w = regions[i].w;
            region[i].h = regions[i].h;

            region[i].intra = regions[i].force_intra;
            region[i].abs_qp_en = regions[i].qp_mode;
            region[i].quality = regions[i].qp_val;
            region[i].area_map_en = 1;
            region[i].qp_area_idx = 0;
        }

        roi_cfg->number = impl->count;
        roi_cfg->regions = region;

        mpp_meta_set_ptr(meta, KEY_ROI_DATA, (void*)roi_cfg);
    } break;
    default : {
    } break;
    }

    impl->count = 0;

    return MPP_OK;
}